

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O2

char * Assimp::FBX::Util::TokenTypeString(TokenType t)

{
  if (t < (TokenType_COMMA|TokenType_DATA)) {
    return &DAT_006734f0 + *(int *)(&DAT_006734f0 + (ulong)t * 4);
  }
  return "";
}

Assistant:

const char* TokenTypeString(TokenType t)
{
    switch(t) {
        case TokenType_OPEN_BRACKET:
            return "TOK_OPEN_BRACKET";

        case TokenType_CLOSE_BRACKET:
            return "TOK_CLOSE_BRACKET";

        case TokenType_DATA:
            return "TOK_DATA";

        case TokenType_COMMA:
            return "TOK_COMMA";

        case TokenType_KEY:
            return "TOK_KEY";

        case TokenType_BINARY_DATA:
            return "TOK_BINARY_DATA";
    }

    ai_assert(false);
    return "";
}